

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void recff_cdata_index(jit_State *J,RecordFFData *rd)

{
  RecordFFData *pRVar1;
  undefined2 uVar2;
  TRef TVar3;
  CType *pCVar4;
  CType *cct;
  CType *fct;
  GCobj *pGStack_3c0;
  CTSize fofs;
  GCstr *name;
  CType *pCStack_3b0;
  IRType t_1;
  CType *ctk;
  GCcdata *cdk;
  undefined4 local_398;
  CTSize sz;
  IRType t;
  CTypeID sid;
  CType *ct;
  CTState *cts;
  GCcdata *cd;
  ptrdiff_t ofs;
  TRef ptr;
  TRef idx;
  RecordFFData *rd_local;
  jit_State *J_local;
  CType *ct_3;
  CType *local_348;
  CType *local_340;
  CType *ct_2;
  CType *local_330;
  jit_State *local_328;
  CType *ct_1;
  CType *local_318;
  jit_State *local_310;
  CType *local_308;
  jit_State *local_300;
  CType *local_2f8;
  undefined2 local_2ee;
  undefined2 local_2ec;
  undefined2 local_2ea;
  RecordFFData *local_2e8;
  undefined2 local_2de;
  undefined2 local_2dc;
  undefined2 local_2da;
  RecordFFData *local_2d8;
  undefined2 local_2ce;
  undefined2 local_2cc;
  undefined2 local_2ca;
  RecordFFData *local_2c8;
  undefined2 local_2be;
  undefined2 local_2bc;
  undefined2 local_2ba;
  RecordFFData *local_2b8;
  undefined2 local_2ae;
  undefined2 local_2ac;
  undefined2 local_2aa;
  RecordFFData *local_2a8;
  undefined2 local_29e;
  undefined2 local_29c;
  undefined2 local_29a;
  RecordFFData *local_298;
  undefined2 local_28e;
  undefined2 local_28c;
  ushort local_28a;
  RecordFFData *local_288;
  undefined2 local_27e;
  undefined2 local_27c;
  undefined2 local_27a;
  RecordFFData *local_278;
  undefined2 local_26e;
  undefined2 local_26c;
  ushort local_26a;
  RecordFFData *local_268;
  undefined2 local_25e;
  undefined2 local_25c;
  ushort local_25a;
  RecordFFData *local_258;
  undefined2 local_24e;
  undefined2 local_24c;
  undefined2 local_24a;
  RecordFFData *local_248;
  undefined2 local_23e;
  undefined2 local_23c;
  undefined2 local_23a;
  RecordFFData *local_238;
  undefined2 local_22e;
  undefined2 local_22c;
  undefined2 local_22a;
  RecordFFData *local_228;
  undefined2 local_21e;
  undefined2 local_21c;
  ushort local_21a;
  RecordFFData *local_218;
  jit_State *local_210;
  CType *local_208;
  jit_State *local_200;
  CType *local_1f8;
  jit_State *local_1f0;
  CType *local_1e8;
  CType *local_1e0;
  CType *local_1d8;
  jit_State *local_1d0;
  CType *local_1c8;
  CType *local_1c0;
  CType *local_1b8;
  CType *local_1b0;
  CType *local_1a8;
  TValue local_1a0;
  TValue tv;
  RecordFFData *local_190;
  uint local_184;
  CType *local_180;
  uint local_174;
  CType *local_170;
  uint local_164;
  CType *local_160;
  uint local_154;
  CType *local_150;
  uint local_144;
  CType *local_140;
  uint local_134;
  CType *local_130;
  uint local_124;
  CType *local_120;
  uint local_114;
  CType *local_110;
  uint local_104;
  CType *local_100;
  CTypeID local_f4;
  CType *local_f0;
  uint local_e4;
  CType *local_e0;
  CTSize local_d4;
  CType *local_d0;
  CTSize local_c4;
  CType *local_c0;
  uint local_b4;
  CType *local_b0;
  CTypeID local_a4;
  CType *local_a0;
  uint local_94;
  CType *local_90;
  uint local_84;
  CType *local_80;
  uint local_74;
  CType *local_70;
  uint local_64;
  CType *local_60;
  uint local_54;
  CType *local_50;
  uint local_44;
  CType *local_40;
  uint local_34;
  CType *local_30;
  uint local_24;
  CType *local_20;
  uint local_14;
  CType *local_10;
  
  ofs._0_4_ = *J->base;
  cd = (GCcdata *)0x10;
  _ptr = rd;
  rd_local = (RecordFFData *)J;
  cts = (CTState *)argv2cdata(J,(TRef)ofs,rd->argv);
  ct = (CType *)rd_local[-0xf].nres;
  ct_1._4_4_ = (uint)*(uint16_t *)((long)&cts->top + 2);
  local_328 = (jit_State *)(*(long *)ct + (ulong)ct_1._4_4_ * 0x18);
  while ((uint)(local_328->cur).nextgc.gcptr64 >> 0x1c == 8) {
    local_1f0 = local_328;
    local_144 = (uint)(local_328->cur).nextgc.gcptr64 & 0xffff;
    local_328 = (jit_State *)(*(long *)ct + (ulong)local_144 * 0x18);
    local_1e8 = ct;
    local_140 = ct;
    local_54 = local_144;
    local_50 = ct;
  }
  _t = local_328;
  sz = 0;
  local_318 = ct;
  local_114 = ct_1._4_4_;
  local_110 = ct;
  local_84 = ct_1._4_4_;
  local_80 = ct;
  if ((uint)(local_328->cur).nextgc.gcptr64 >> 0x1c == 2) {
    local_398 = 5;
    if (*(CTSize *)((long)&(local_328->cur).nextgc.gcptr64 + 4) == 8) {
      local_398 = 9;
    }
    if (((local_328->cur).nextgc.gcptr64 & 0xf0800000) == 0x20800000) {
      local_300 = local_328;
      do {
        local_210 = local_300;
        local_124 = (uint)(local_300->cur).nextgc.gcptr64 & 0xffff;
        _t = (jit_State *)(*(long *)ct + (ulong)local_124 * 0x18);
        local_300 = _t;
        local_2f8 = ct;
        local_208 = ct;
        local_120 = ct;
        local_74 = local_124;
        local_70 = ct;
      } while ((uint)(_t->cur).nextgc.gcptr64 >> 0x1c == 8);
    }
    local_21a = (ushort)local_398 | 0x4500;
    local_218 = rd_local;
    local_21c = (undefined2)(TRef)ofs;
    local_21e = 0x17;
    *(ushort *)&rd_local[7].field_0x14 = local_21a;
    *(undefined2 *)&rd_local[7].data = local_21c;
    *(undefined2 *)((long)&rd_local[7].data + 2) = 0x17;
    ofs._0_4_ = lj_opt_fold((jit_State *)rd_local);
    cd = (GCcdata *)0x0;
    ofs._0_4_ = crec_reassoc_ofs((jit_State *)rd_local,(TRef)ofs,(ptrdiff_t *)&cd,1);
  }
  do {
    pCVar4 = ct;
    ofs._4_4_ = *(uint *)(*(long *)&rd_local[6].data + 4);
    if ((ofs._4_4_ >> 0x18 & 0x1f) - 0xe < 6) {
      ofs._4_4_ = lj_opt_narrow_cindex((jit_State *)rd_local,ofs._4_4_);
      if ((uint)(_t->cur).nextgc.gcptr64 >> 0x1d == 1) {
LAB_0015fe53:
        pRVar1 = rd_local;
        if (((_t->cur).nextgc.gcptr64 & 0x4000000) != 0) {
          uVar2 = (undefined2)ofs._4_4_;
          TVar3 = lj_ir_kint64((jit_State *)rd_local,1);
          local_228 = pRVar1;
          local_22a = 0x2115;
          local_22e = (undefined2)TVar3;
          *(undefined2 *)&pRVar1[7].field_0x14 = 0x2115;
          *(undefined2 *)&pRVar1[7].data = uVar2;
          *(undefined2 *)((long)&pRVar1[7].data + 2) = local_22e;
          local_22c = uVar2;
          ofs._4_4_ = lj_opt_fold((jit_State *)rd_local);
        }
        sz = (uint)(_t->cur).nextgc.gcptr64 & 0xffff;
        cdk._4_4_ = lj_ctype_size((CTState *)ct,sz);
        ofs._4_4_ = crec_reassoc_ofs((jit_State *)rd_local,ofs._4_4_,(ptrdiff_t *)&cd,cdk._4_4_);
        pRVar1 = rd_local;
        uVar2 = (undefined2)ofs._4_4_;
        TVar3 = lj_ir_kint64((jit_State *)rd_local,(ulong)cdk._4_4_);
        local_238 = pRVar1;
        local_23a = 0x2b15;
        local_23e = (undefined2)TVar3;
        *(undefined2 *)&pRVar1[7].field_0x14 = 0x2b15;
        *(undefined2 *)&pRVar1[7].data = uVar2;
        *(undefined2 *)((long)&pRVar1[7].data + 2) = local_23e;
        local_23c = uVar2;
        ofs._4_4_ = lj_opt_fold((jit_State *)rd_local);
        local_24c = (undefined2)ofs._4_4_;
        local_248 = rd_local;
        local_24a = 0x2909;
        local_24e = (undefined2)(TRef)ofs;
        *(undefined2 *)&rd_local[7].field_0x14 = 0x2909;
        *(undefined2 *)&rd_local[7].data = local_24c;
        *(undefined2 *)((long)&rd_local[7].data + 2) = local_24e;
        ofs._0_4_ = lj_opt_fold((jit_State *)rd_local);
      }
    }
    else if ((ofs._4_4_ & 0x1f000000) == 0xa000000) {
      ctk = (CType *)(_ptr->argv[1].u64 & 0x7fffffffffff);
      local_330 = ct;
      ct_2._4_4_ = (uint)ctk->next;
      local_100 = ct;
      local_90 = ct;
      local_340 = (CType *)(*(long *)ct + (ulong)ct_2._4_4_ * 0x18);
      while (local_340->info >> 0x1c == 8) {
        local_1d8 = ct;
        local_1e0 = local_340;
        local_150 = ct;
        local_154 = local_340->info & 0xffff;
        local_40 = ct;
        local_44 = local_154;
        local_340 = (CType *)(*(long *)ct + (ulong)local_154 * 0x18);
      }
      pCStack_3b0 = local_340;
      local_104 = ct_2._4_4_;
      local_94 = ct_2._4_4_;
      name._4_4_ = crec_ct2irt((CTState *)ct,local_340);
      pRVar1 = rd_local;
      if ((((uint)(_t->cur).nextgc.gcptr64 >> 0x1d == 1) && (IRT_NUM < name._4_4_)) &&
         (name._4_4_ < IRT_SOFTFP)) {
        uVar2 = (undefined2)ofs._4_4_;
        if (pCStack_3b0->size == 8) {
          local_25a = (ushort)name._4_4_ | 0x4500;
          local_258 = rd_local;
          local_25e = 0x19;
          *(ushort *)&rd_local[7].field_0x14 = local_25a;
          *(undefined2 *)&rd_local[7].data = uVar2;
          *(undefined2 *)((long)&rd_local[7].data + 2) = 0x19;
          local_25c = uVar2;
          ofs._4_4_ = lj_opt_fold((jit_State *)rd_local);
        }
        else if (pCStack_3b0->size == 4) {
          local_26a = (ushort)name._4_4_ | 0x4500;
          local_268 = rd_local;
          local_26e = 0x18;
          *(ushort *)&rd_local[7].field_0x14 = local_26a;
          *(undefined2 *)&rd_local[7].data = uVar2;
          *(undefined2 *)((long)&rd_local[7].data + 2) = 0x18;
          local_26c = uVar2;
          ofs._4_4_ = lj_opt_fold((jit_State *)rd_local);
        }
        else {
          TVar3 = lj_ir_kint64((jit_State *)rd_local,0x10);
          local_278 = pRVar1;
          local_27a = 0x2909;
          local_27e = (undefined2)TVar3;
          *(undefined2 *)&pRVar1[7].field_0x14 = 0x2909;
          *(undefined2 *)&pRVar1[7].data = uVar2;
          *(undefined2 *)((long)&pRVar1[7].data + 2) = local_27e;
          local_27c = uVar2;
          ofs._4_4_ = lj_opt_fold((jit_State *)rd_local);
          local_28a = (ushort)name._4_4_ | 0x4600;
          local_288 = rd_local;
          local_28c = (undefined2)ofs._4_4_;
          local_28e = 0;
          *(ushort *)&rd_local[7].field_0x14 = local_28a;
          *(undefined2 *)&rd_local[7].data = local_28c;
          *(undefined2 *)((long)&rd_local[7].data + 2) = 0;
          ofs._4_4_ = lj_opt_fold((jit_State *)rd_local);
        }
        if ((pCStack_3b0->size < 8) && ((pCStack_3b0->info & 0x800000) == 0)) {
          local_298 = rd_local;
          local_29a = 0x5b15;
          local_29c = (undefined2)ofs._4_4_;
          local_29e = 0xab3;
          *(undefined2 *)&rd_local[7].field_0x14 = 0x5b15;
          *(undefined2 *)&rd_local[7].data = local_29c;
          *(undefined2 *)((long)&rd_local[7].data + 2) = 0xab3;
          ofs._4_4_ = lj_opt_fold((jit_State *)rd_local);
        }
        goto LAB_0015fe53;
      }
    }
    else if ((ofs._4_4_ & 0x1f000000) == 0x4000000) {
      pGStack_3c0 = (GCobj *)(_ptr->argv[1].u64 & 0x7fffffffffff);
      if ((cts != (CTState *)0x0) && (*(short *)((long)&cts->top + 2) == 0x16)) {
        ct_3._4_4_ = crec_constructor((jit_State *)rd_local,(GCcdata *)cts,(TRef)ofs);
        local_348 = pCVar4;
        local_f0 = pCVar4;
        local_a0 = pCVar4;
        J_local = (jit_State *)(*(long *)pCVar4 + (ulong)ct_3._4_4_ * 0x18);
        while ((uint)(J_local->cur).nextgc.gcptr64 >> 0x1c == 8) {
          local_1c8 = pCVar4;
          local_1d0 = J_local;
          local_160 = pCVar4;
          local_164 = (uint)(J_local->cur).nextgc.gcptr64 & 0xffff;
          local_30 = pCVar4;
          J_local = (jit_State *)(*(long *)pCVar4 + (ulong)local_164 * 0x18);
          local_34 = local_164;
        }
        _t = J_local;
        local_f4 = ct_3._4_4_;
        local_a4 = ct_3._4_4_;
      }
      pRVar1 = rd_local;
      if ((uint)(_t->cur).nextgc.gcptr64 >> 0x1c == 1) {
        pCVar4 = lj_ctype_getfieldq((CTState *)ct,(CType *)_t,&pGStack_3c0->str,
                                    (CTSize *)((long)&fct + 4),(CTInfo *)0x0);
        pRVar1 = rd_local;
        if (pCVar4 != (CType *)0x0) {
          cd = (GCcdata *)((long)&(cd->nextgc).gcptr64 + (ulong)fct._4_4_);
          uVar2 = (undefined2)ofs._4_4_;
          TVar3 = lj_ir_kgc((jit_State *)rd_local,pGStack_3c0,IRT_STR);
          local_2a8 = pRVar1;
          local_2aa = 0x884;
          local_2ae = (undefined2)TVar3;
          *(undefined2 *)&pRVar1[7].field_0x14 = 0x884;
          *(undefined2 *)&pRVar1[7].data = uVar2;
          *(undefined2 *)((long)&pRVar1[7].data + 2) = local_2ae;
          local_2ac = uVar2;
          lj_opt_fold((jit_State *)rd_local);
          pRVar1 = rd_local;
          if (pCVar4->info >> 0x1c == 0xb) {
            if (0x7fffffff < pCVar4->size) {
              local_1a8 = ct;
              local_184 = pCVar4->info & 0xffff;
              local_180 = ct;
              local_10 = ct;
              local_1b0 = pCVar4;
              local_14 = local_184;
              if ((*(uint *)(*(long *)ct + (ulong)local_184 * 0x18) & 0x800000) != 0) {
                local_1a0.n = (lua_Number)pCVar4->size;
                local_190 = rd_local;
                tv.u64 = local_1a0.u64;
                TVar3 = lj_ir_knum_u64((jit_State *)rd_local,local_1a0.u64);
                **(TRef **)&rd_local[6].data = TVar3;
                return;
              }
            }
            TVar3 = lj_ir_kint((jit_State *)rd_local,pCVar4->size);
            **(TRef **)&rd_local[6].data = TVar3;
            return;
          }
          if (pCVar4->info >> 0x1c == 10) {
            if (cd != (GCcdata *)0x0) {
              uVar2 = (undefined2)(TRef)ofs;
              TVar3 = lj_ir_kint64((jit_State *)rd_local,(uint64_t)cd);
              local_2b8 = pRVar1;
              local_2ba = 0x2909;
              local_2be = (undefined2)TVar3;
              *(undefined2 *)&pRVar1[7].field_0x14 = 0x2909;
              *(undefined2 *)&pRVar1[7].data = uVar2;
              *(undefined2 *)((long)&pRVar1[7].data + 2) = local_2be;
              local_2bc = uVar2;
              ofs._0_4_ = lj_opt_fold((jit_State *)rd_local);
            }
            crec_index_bf((jit_State *)rd_local,_ptr,(TRef)ofs,pCVar4->info);
            return;
          }
          sz = pCVar4->info & 0xffff;
        }
      }
      else if (((((_t->cur).nextgc.gcptr64 & 0xf4000000) == 0x34000000) &&
               ((pGStack_3c0->str).len == 2)) &&
              ((((char)(pGStack_3c0->gch).gclist.gcptr64 == 'r' &&
                (*(char *)((long)&(pGStack_3c0->gch).gclist.gcptr64 + 1) == 'e')) ||
               (((char)(pGStack_3c0->gch).gclist.gcptr64 == 'i' &&
                (*(char *)((long)&(pGStack_3c0->gch).gclist.gcptr64 + 1) == 'm')))))) {
        uVar2 = (undefined2)ofs._4_4_;
        TVar3 = lj_ir_kgc((jit_State *)rd_local,pGStack_3c0,IRT_STR);
        local_2c8 = pRVar1;
        local_2ca = 0x884;
        local_2ce = (undefined2)TVar3;
        *(undefined2 *)&pRVar1[7].field_0x14 = 0x884;
        *(undefined2 *)&pRVar1[7].data = uVar2;
        *(undefined2 *)((long)&pRVar1[7].data + 2) = local_2ce;
        local_2cc = uVar2;
        lj_opt_fold((jit_State *)rd_local);
        if ((char)(pGStack_3c0->gch).gclist.gcptr64 == 'i') {
          cd = (GCcdata *)
               ((long)&(cd->nextgc).gcptr64 +
               (ulong)(*(CTSize *)((long)&(_t->cur).nextgc.gcptr64 + 4) >> 1));
        }
        sz = (uint)(_t->cur).nextgc.gcptr64 & 0xffff;
      }
    }
    pRVar1 = rd_local;
    if (sz != 0) {
      if (cd != (GCcdata *)0x0) {
        uVar2 = (undefined2)(TRef)ofs;
        TVar3 = lj_ir_kint64((jit_State *)rd_local,(uint64_t)cd);
        local_2d8 = pRVar1;
        local_2da = 0x2909;
        local_2de = (undefined2)TVar3;
        *(undefined2 *)&pRVar1[7].field_0x14 = 0x2909;
        *(undefined2 *)&pRVar1[7].data = uVar2;
        *(undefined2 *)((long)&pRVar1[7].data + 2) = local_2de;
        local_2dc = uVar2;
        ofs._0_4_ = lj_opt_fold((jit_State *)rd_local);
      }
      local_d0 = ct;
      local_d4 = sz;
      local_c0 = ct;
      local_c4 = sz;
      _t = (jit_State *)(*(long *)ct + (ulong)sz * 0x18);
      if ((((CType *)_t)->info & 0xf0800000) == 0x20800000) {
        local_2e8 = rd_local;
        local_2ea = 0x4609;
        local_2ec = (undefined2)(TRef)ofs;
        local_2ee = 0;
        *(undefined2 *)&rd_local[7].field_0x14 = 0x4609;
        *(undefined2 *)&rd_local[7].data = local_2ec;
        *(undefined2 *)((long)&rd_local[7].data + 2) = 0;
        ofs._0_4_ = lj_opt_fold((jit_State *)rd_local);
        local_b4 = ((CType *)_t)->info & 0xffff;
        local_e0 = ct;
        local_b0 = ct;
        _t = (jit_State *)(*(long *)ct + (ulong)local_b4 * 0x18);
        local_e4 = local_b4;
        sz = local_b4;
      }
      while (((CType *)_t)->info >> 0x1c == 8) {
        local_1b8 = ct;
        local_1c0 = (CType *)_t;
        local_170 = ct;
        local_174 = ((CType *)_t)->info & 0xffff;
        local_20 = ct;
        local_24 = local_174;
        _t = (jit_State *)(*(long *)ct + (ulong)local_174 * 0x18);
      }
      if (_ptr->data == 0) {
        TVar3 = crec_tv_ct((jit_State *)rd_local,(CType *)_t,sz,(TRef)ofs);
        **(TRef **)&rd_local[6].data = TVar3;
        return;
      }
      _ptr->nres = 0;
      *(undefined1 *)((long)&rd_local[7].nres + 5) = 1;
      crec_ct_tv((jit_State *)rd_local,(CType *)_t,(TRef)ofs,
                 *(TRef *)(*(long *)&rd_local[6].data + 8),_ptr->argv + 2);
      return;
    }
    if ((uint)(_t->cur).nextgc.gcptr64 >> 0x1c != 2) {
LAB_00160c65:
      crec_index_meta((jit_State *)rd_local,(CTState *)ct,(CType *)_t,_ptr);
      return;
    }
    local_308 = ct;
    local_310 = _t;
    do {
      local_1f8 = ct;
      local_200 = local_310;
      local_130 = ct;
      local_134 = (uint)(local_310->cur).nextgc.gcptr64 & 0xffff;
      local_60 = ct;
      local_310 = (jit_State *)(*(long *)ct + (ulong)local_134 * 0x18);
    } while ((uint)(local_310->cur).nextgc.gcptr64 >> 0x1c == 8);
    local_64 = local_134;
    if (((uint)(local_310->cur).nextgc.gcptr64 >> 0x1c != 1) ||
       (cts = (CTState *)0x0, _t = local_310, (ofs._4_4_ & 0x1f000000) != 0x4000000))
    goto LAB_00160c65;
  } while( true );
}

Assistant:

void LJ_FASTCALL recff_cdata_index(jit_State *J, RecordFFData *rd)
{
  TRef idx, ptr = J->base[0];
  ptrdiff_t ofs = sizeof(GCcdata);
  GCcdata *cd = argv2cdata(J, ptr, &rd->argv[0]);
  CTState *cts = ctype_ctsG(J2G(J));
  CType *ct = ctype_raw(cts, cd->ctypeid);
  CTypeID sid = 0;

  /* Resolve pointer or reference for cdata object. */
  if (ctype_isptr(ct->info)) {
    IRType t = (LJ_64 && ct->size == 8) ? IRT_P64 : IRT_P32;
    if (ctype_isref(ct->info)) ct = ctype_rawchild(cts, ct);
    ptr = emitir(IRT(IR_FLOAD, t), ptr, IRFL_CDATA_PTR);
    ofs = 0;
    ptr = crec_reassoc_ofs(J, ptr, &ofs, 1);
  }

again:
  idx = J->base[1];
  if (tref_isnumber(idx)) {
    idx = lj_opt_narrow_cindex(J, idx);
    if (ctype_ispointer(ct->info)) {
      CTSize sz;
  integer_key:
      if ((ct->info & CTF_COMPLEX))
	idx = emitir(IRT(IR_BAND, IRT_INTP), idx, lj_ir_kintp(J, 1));
      sz = lj_ctype_size(cts, (sid = ctype_cid(ct->info)));
      idx = crec_reassoc_ofs(J, idx, &ofs, sz);
#if LJ_TARGET_ARM || LJ_TARGET_PPC
      /* Hoist base add to allow fusion of index/shift into operands. */
      if (LJ_LIKELY(J->flags & JIT_F_OPT_LOOP) && ofs
#if LJ_TARGET_ARM
	  && (sz == 1 || sz == 4)
#endif
	  ) {
	ptr = emitir(IRT(IR_ADD, IRT_PTR), ptr, lj_ir_kintp(J, ofs));
	ofs = 0;
      }
#endif
      idx = emitir(IRT(IR_MUL, IRT_INTP), idx, lj_ir_kintp(J, sz));
      ptr = emitir(IRT(IR_ADD, IRT_PTR), idx, ptr);
    }
  } else if (tref_iscdata(idx)) {
    GCcdata *cdk = cdataV(&rd->argv[1]);
    CType *ctk = ctype_raw(cts, cdk->ctypeid);
    IRType t = crec_ct2irt(cts, ctk);
    if (ctype_ispointer(ct->info) && t >= IRT_I8 && t <= IRT_U64) {
      if (ctk->size == 8) {
	idx = emitir(IRT(IR_FLOAD, t), idx, IRFL_CDATA_INT64);
      } else if (ctk->size == 4) {
	idx = emitir(IRT(IR_FLOAD, t), idx, IRFL_CDATA_INT);
      } else {
	idx = emitir(IRT(IR_ADD, IRT_PTR), idx,
		     lj_ir_kintp(J, sizeof(GCcdata)));
	idx = emitir(IRT(IR_XLOAD, t), idx, 0);
      }
      if (LJ_64 && ctk->size < sizeof(intptr_t) && !(ctk->info & CTF_UNSIGNED))
	idx = emitconv(idx, IRT_INTP, IRT_INT, IRCONV_SEXT);
      if (!LJ_64 && ctk->size > sizeof(intptr_t)) {
	idx = emitconv(idx, IRT_INTP, t, 0);
	lj_needsplit(J);
      }
      goto integer_key;
    }
  } else if (tref_isstr(idx)) {
    GCstr *name = strV(&rd->argv[1]);
    if (cd && cd->ctypeid == CTID_CTYPEID)
      ct = ctype_raw(cts, crec_constructor(J, cd, ptr));
    if (ctype_isstruct(ct->info)) {
      CTSize fofs;
      CType *fct;
      fct = lj_ctype_getfield(cts, ct, name, &fofs);
      if (fct) {
	ofs += (ptrdiff_t)fofs;
	/* Always specialize to the field name. */
	emitir(IRTG(IR_EQ, IRT_STR), idx, lj_ir_kstr(J, name));
	if (ctype_isconstval(fct->info)) {
	  if (fct->size >= 0x80000000u &&
	      (ctype_child(cts, fct)->info & CTF_UNSIGNED)) {
	    J->base[0] = lj_ir_knum(J, (lua_Number)(uint32_t)fct->size);
	    return;
	  }
	  J->base[0] = lj_ir_kint(J, (int32_t)fct->size);
	  return;  /* Interpreter will throw for newindex. */
	} else if (ctype_isbitfield(fct->info)) {
	  if (ofs)
	    ptr = emitir(IRT(IR_ADD, IRT_PTR), ptr, lj_ir_kintp(J, ofs));
	  crec_index_bf(J, rd, ptr, fct->info);
	  return;
	} else {
	  lj_assertJ(ctype_isfield(fct->info), "field expected");
	  sid = ctype_cid(fct->info);
	}
      }
    } else if (ctype_iscomplex(ct->info)) {
      if (name->len == 2 &&
	  ((strdata(name)[0] == 'r' && strdata(name)[1] == 'e') ||
	   (strdata(name)[0] == 'i' && strdata(name)[1] == 'm'))) {
	/* Always specialize to the field name. */
	emitir(IRTG(IR_EQ, IRT_STR), idx, lj_ir_kstr(J, name));
	if (strdata(name)[0] == 'i') ofs += (ct->size >> 1);
	sid = ctype_cid(ct->info);
      }
    }
  }
  if (!sid) {
    if (ctype_isptr(ct->info)) {  /* Automatically perform '->'. */
      CType *cct = ctype_rawchild(cts, ct);
      if (ctype_isstruct(cct->info)) {
	ct = cct;
	cd = NULL;
	if (tref_isstr(idx)) goto again;
      }
    }
    crec_index_meta(J, cts, ct, rd);
    return;
  }

  if (ofs)
    ptr = emitir(IRT(IR_ADD, IRT_PTR), ptr, lj_ir_kintp(J, ofs));

  /* Resolve reference for field. */
  ct = ctype_get(cts, sid);
  if (ctype_isref(ct->info)) {
    ptr = emitir(IRT(IR_XLOAD, IRT_PTR), ptr, 0);
    sid = ctype_cid(ct->info);
    ct = ctype_get(cts, sid);
  }

  while (ctype_isattrib(ct->info))
    ct = ctype_child(cts, ct);  /* Skip attributes. */

  if (rd->data == 0) {  /* __index metamethod. */
    J->base[0] = crec_tv_ct(J, ct, sid, ptr);
  } else {  /* __newindex metamethod. */
    rd->nres = 0;
    J->needsnap = 1;
    crec_ct_tv(J, ct, ptr, J->base[2], &rd->argv[2]);
  }
}